

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cpp
# Opt level: O2

int EigenRealGeneral(int n,double **a,double *v,double *vi,double **u,int *iwork,double *work)

{
  double **ppdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  double dVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  uint uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  ulong uVar43;
  int iVar44;
  long lVar45;
  uint uVar46;
  double **ppdVar48;
  uint uVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  double dVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  double dVar81;
  double dVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 in_ZMM5 [64];
  undefined8 uVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 in_ZMM6 [64];
  double dVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  double dVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar155 [16];
  uint local_1c4;
  undefined1 local_178 [32];
  ulong local_158;
  double local_128;
  double local_f8;
  double local_a8;
  ulong uVar47;
  
  uVar23 = n - 1;
  uVar46 = uVar23;
  for (uVar49 = uVar23; lVar34 = (long)n, -1 < (int)uVar49; uVar49 = uVar49 - 1) {
    uVar42 = 0xffffffff;
    if (-1 < (int)uVar46) {
      uVar42 = uVar46;
    }
    for (uVar32 = 0; (long)(int)uVar42 + 1U != uVar32; uVar32 = uVar32 + 1) {
      if ((uVar49 != uVar32) && ((a[uVar49][uVar32] != 0.0 || (NAN(a[uVar49][uVar32])))))
      goto LAB_0010ed6b;
    }
    Exchange(uVar49,0,uVar46,uVar46,n,a,work);
    uVar42 = uVar46 - 1;
    bVar50 = (int)uVar46 < 1;
    uVar46 = uVar42;
    uVar42 = 0;
    if (bVar50) goto LAB_0010ef64;
LAB_0010ed6b:
  }
  lVar28 = (long)(int)uVar46;
  lVar33 = -1;
  if (-1 < lVar28) {
    lVar33 = lVar28;
  }
  uVar42 = 0;
  for (lVar40 = 0; lVar35 = (long)(int)uVar42, lVar36 = lVar35, lVar40 != lVar33 + 1;
      lVar40 = lVar40 + 1) {
    for (; lVar35 <= lVar28; lVar35 = lVar35 + 1) {
      if ((lVar40 != lVar35) && ((a[lVar35][lVar40] != 0.0 || (NAN(a[lVar35][lVar40])))))
      goto LAB_0010edf1;
    }
    Exchange((int)lVar40,uVar42,uVar46,uVar42,n,a,work);
    uVar42 = uVar42 + 1;
LAB_0010edf1:
  }
  for (; lVar36 <= lVar28; lVar36 = lVar36 + 1) {
    work[lVar36] = 1.0;
  }
  in_ZMM5 = ZEXT1664(ZEXT816(0x3fd0000000000000));
  auVar51._8_8_ = 0x7fffffffffffffff;
  auVar51._0_8_ = 0x7fffffffffffffff;
  in_ZMM6 = ZEXT1664(auVar51);
  lVar40 = lVar35;
  bVar50 = false;
  do {
    for (; bVar21 = bVar50, lVar40 <= lVar28; lVar40 = lVar40 + 1) {
      auVar148 = ZEXT864(0) << 0x40;
      lVar36 = lVar35;
      while( true ) {
        auVar52 = auVar148._0_16_;
        dVar99 = auVar148._0_8_;
        if (lVar28 < lVar36) break;
        if (lVar40 != lVar36) {
          auVar52._8_8_ = 0;
          auVar52._0_8_ = a[lVar36][lVar40];
          auVar52 = vmovhpd_avx(auVar52,a[lVar40][lVar36]);
          auVar52 = vandpd_avx(auVar52,auVar51);
          auVar148 = ZEXT1664(CONCAT88(auVar52._8_8_ + auVar148._8_8_,auVar52._0_8_ + dVar99));
        }
        lVar36 = lVar36 + 1;
      }
      if ((dVar99 != 0.0) || (NAN(dVar99))) {
        auVar69 = vshufpd_avx(auVar52,auVar52,1);
        dVar114 = auVar69._0_8_;
        if ((dVar114 != 0.0) || (NAN(dVar114))) {
          auVar148 = ZEXT1664(ZEXT816(0x3ff0000000000000));
          for (auVar149 = ZEXT1664(auVar52); auVar149._0_8_ < dVar114 * 0.5;
              auVar149 = ZEXT864((ulong)(auVar149._0_8_ * 4.0))) {
            auVar148 = ZEXT864((ulong)(auVar148._0_8_ + auVar148._0_8_));
          }
          while( true ) {
            dVar81 = auVar149._0_8_;
            dVar82 = auVar148._0_8_;
            if (dVar81 < dVar114 + dVar114) break;
            auVar148 = ZEXT864((ulong)(dVar82 * 0.5));
            auVar149 = ZEXT864((ulong)(dVar81 * 0.25));
          }
          if ((dVar114 + dVar81) / dVar82 < (dVar114 + dVar99) * 0.95) {
            work[lVar40] = dVar82 * work[lVar40];
            for (lVar36 = lVar35; lVar36 < lVar34; lVar36 = lVar36 + 1) {
              a[lVar40][lVar36] = (1.0 / dVar82) * a[lVar40][lVar36];
            }
            for (lVar36 = 0; lVar33 + 1 != lVar36; lVar36 = lVar36 + 1) {
              a[lVar36][lVar40] = dVar82 * a[lVar36][lVar40];
            }
            bVar21 = true;
          }
        }
      }
      bVar50 = bVar21;
    }
    lVar40 = lVar35;
    bVar50 = false;
  } while (bVar21);
LAB_0010ef64:
  EigenRG(int,double**,double*,double*,double**,int*,double*)::is1 = uVar42;
  EigenRG(int,double**,double*,double*,double**,int*,double*)::is2 = uVar46;
  if ((int)(EigenRG(int,double**,double*,double*,double**,int*,double*)::is1 + 1) < (int)uVar46) {
    lVar28 = (long)(int)uVar46;
    auVar69._8_8_ = 0x7fffffffffffffff;
    auVar69._0_8_ = 0x7fffffffffffffff;
    lVar33 = -1;
    if (-1 < lVar28) {
      lVar33 = lVar28;
    }
    uVar32 = (long)(int)EigenRG(int,double**,double*,double*,double**,int*,double*)::is1;
    while (uVar47 = uVar32, uVar32 = uVar47 + 1, (long)uVar32 < lVar28) {
      uVar29 = uVar32 & 0xffffffff;
      auVar51 = ZEXT816(0) << 0x40;
      for (uVar39 = uVar32; dVar99 = auVar51._0_8_, (long)uVar39 <= lVar28; uVar39 = uVar39 + 1) {
        auVar52 = vandpd_avx(auVar51,auVar69);
        in_ZMM6 = ZEXT1664(auVar52);
        auVar53._8_8_ = 0;
        auVar53._0_8_ = a[uVar39][uVar47];
        auVar53 = vandpd_avx(auVar53,auVar69);
        in_ZMM5 = ZEXT1664(auVar53);
        uVar95 = vcmpsd_avx512f(auVar52,auVar53,1);
        bVar50 = (bool)((byte)uVar95 & 1);
        auVar54._0_8_ = (ulong)bVar50 * (long)a[uVar39][uVar47] + (ulong)!bVar50 * (long)dVar99;
        auVar54._8_8_ = auVar51._8_8_;
        if (auVar52._0_8_ < auVar53._0_8_) {
          uVar29 = uVar39 & 0xffffffff;
        }
        auVar51 = auVar54;
      }
      iVar24 = (int)uVar29;
      iwork[uVar47 + 1] = iVar24;
      if (iVar24 != (int)uVar32) {
        for (uVar39 = uVar47; (long)uVar39 < lVar34; uVar39 = uVar39 + 1) {
          pdVar16 = a[uVar47 + 1];
          dVar114 = a[iVar24][uVar39];
          dVar82 = pdVar16[uVar39];
          in_ZMM5 = ZEXT864((ulong)dVar82);
          a[iVar24][uVar39] = dVar82;
          pdVar16[uVar39] = dVar114;
        }
        for (lVar40 = 0; lVar33 + 1 != lVar40; lVar40 = lVar40 + 1) {
          pdVar16 = a[lVar40];
          dVar114 = pdVar16[iVar24];
          in_ZMM5 = ZEXT864((ulong)pdVar16[uVar47 + 1]);
          pdVar16[iVar24] = pdVar16[uVar47 + 1];
          pdVar16[uVar47 + 1] = dVar114;
        }
      }
      uVar39 = uVar32;
      if ((dVar99 != 0.0) || (NAN(dVar99))) {
        while (uVar29 = uVar39, (long)uVar29 < lVar28) {
          pdVar16 = a[uVar29 + 1];
          dVar114 = pdVar16[uVar47];
          uVar39 = uVar29 + 1;
          if ((dVar114 != 0.0) || (NAN(dVar114))) {
            auVar59._0_8_ = dVar114 / dVar99;
            auVar59._8_8_ = 0;
            auVar58._0_8_ = -auVar59._0_8_;
            auVar58._8_8_ = 0x8000000000000000;
            pdVar16[uVar47] = auVar59._0_8_;
            for (uVar43 = uVar32; (long)uVar43 < lVar34; uVar43 = uVar43 + 1) {
              auVar61._8_8_ = 0;
              auVar61._0_8_ = a[uVar47 + 1][uVar43];
              auVar60._8_8_ = 0;
              auVar60._0_8_ = pdVar16[uVar43];
              auVar51 = vfmadd213sd_fma(auVar61,auVar58,auVar60);
              in_ZMM6 = ZEXT1664(auVar51);
              pdVar16[uVar43] = auVar51._0_8_;
            }
            lVar40 = 0;
            while (in_ZMM5 = ZEXT1664(auVar58), lVar33 + 1 != lVar40) {
              pdVar16 = a[lVar40];
              lVar40 = lVar40 + 1;
              auVar66._8_8_ = 0;
              auVar66._0_8_ = pdVar16[uVar29 + 1];
              auVar65._8_8_ = 0;
              auVar65._0_8_ = pdVar16[uVar47 + 1];
              auVar58 = vfmadd213sd_fma(auVar66,auVar59,auVar65);
              pdVar16[uVar47 + 1] = auVar58._0_8_;
            }
          }
        }
      }
    }
  }
  local_1c4 = EigenRG(int,double**,double*,double*,double**,int*,double*)::is2;
  uVar49 = EigenRG(int,double**,double*,double*,double**,int*,double*)::is1;
  uVar46 = ~(n >> 0x1f) & n;
  uVar47 = (ulong)uVar46;
  for (uVar32 = 0; uVar32 != uVar47; uVar32 = uVar32 + 1) {
    for (uVar39 = 0; (uint)n != uVar39; uVar39 = uVar39 + 1) {
      u[uVar39][uVar32] = 0.0;
    }
    u[uVar32][uVar32] = 1.0;
  }
  lVar28 = (long)(int)local_1c4;
  lVar33 = lVar28;
  while (lVar40 = lVar33, (int)(uVar49 + 1) < lVar40) {
    lVar33 = lVar40 + -1;
    lVar35 = (long)(int)lVar33;
    for (lVar36 = lVar40; lVar36 <= lVar28; lVar36 = lVar36 + 1) {
      u[lVar36][lVar40 + -1] = a[lVar36][lVar40 + -2];
    }
    if (iwork[lVar40 + -1] != (int)lVar33) {
      pdVar16 = u[iwork[lVar40 + -1]];
      for (; lVar35 <= lVar28; lVar35 = lVar35 + 1) {
        u[lVar40 + -1][lVar35] = pdVar16[lVar35];
        pdVar16[lVar35] = 0.0;
      }
      pdVar16[lVar40 + -1] = 1.0;
    }
  }
  auVar67._8_8_ = 0x7fffffffffffffff;
  auVar67._0_8_ = 0x7fffffffffffffff;
  auVar148 = ZEXT1664(auVar67);
  lVar33 = (long)(int)uVar49;
  dVar99 = 0.0;
  uVar32 = 0;
  for (uVar39 = 0; uVar39 != uVar47; uVar39 = uVar39 + 1) {
    while ((long)uVar32 < lVar34) {
      auVar68._8_8_ = 0;
      auVar68._0_8_ = a[uVar39][uVar32];
      uVar32 = uVar32 + 1;
      auVar51 = vandpd_avx(auVar67,auVar68);
      dVar99 = dVar99 + auVar51._0_8_;
    }
    if (((long)uVar39 < lVar33) || (lVar28 < (long)uVar39)) {
      v[uVar39] = a[uVar39][uVar39];
      vi[uVar39] = 0.0;
    }
    uVar32 = uVar39;
  }
  iVar24 = n * 0x1e;
  auVar51 = vmovddup_avx512vl(ZEXT816(0x7fffffffffffffff));
  auVar52 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  auVar149 = ZEXT1664(auVar52);
  auVar69 = ZEXT816(0) << 0x40;
  dVar114 = 0.0;
  uVar32 = (ulong)local_1c4;
LAB_0010f285:
  uVar42 = (uint)uVar32;
  if ((int)uVar49 <= (int)uVar42) {
    uVar39 = (ulong)(int)uVar42;
    uVar31 = uVar42 - 1;
    uVar25 = uVar42 - 2;
    pdVar16 = a[uVar39];
    lVar40 = (long)(int)uVar25;
    lVar36 = (long)(int)uVar31;
    uVar26 = uVar42 + 2;
    if ((int)uVar42 < (int)(uVar42 + 2)) {
      uVar26 = uVar42;
    }
    if ((int)uVar26 < 0) {
      uVar26 = 0xffffffff;
    }
    auVar22._12_4_ = 0;
    auVar22._0_12_ = local_178._4_12_;
    local_178._0_16_ = auVar22 << 0x20;
    uVar29 = uVar39;
    uVar37 = uVar42 + 1;
LAB_0010f327:
    uVar38 = uVar49;
    if (lVar33 < (long)uVar29) goto code_r0x0010f32c;
    goto LAB_0010f393;
  }
  if ((dVar99 == 0.0) && (!NAN(dVar99))) {
LAB_0011048a:
    if (n != 0) {
      if (local_1c4 != uVar49) {
        for (lVar34 = (long)(int)uVar49; lVar34 <= (int)local_1c4; lVar34 = lVar34 + 1) {
          dVar99 = work[lVar34];
          for (uVar32 = 0; uVar47 != uVar32; uVar32 = uVar32 + 1) {
            u[lVar34][uVar32] = dVar99 * u[lVar34][uVar32];
          }
        }
      }
      for (uVar23 = 0; uVar23 != uVar46; uVar23 = uVar23 + 1) {
        if (((int)uVar23 < (int)uVar49) || ((int)local_1c4 < (int)uVar23)) {
          uVar42 = uVar49 - uVar23;
          if (uVar49 - uVar23 == 0 || (int)uVar49 < (int)uVar23) {
            uVar42 = uVar23;
          }
          dVar99 = work[(int)uVar42];
          if (uVar42 != (int)dVar99) {
            for (uVar32 = 0; uVar47 != uVar32; uVar32 = uVar32 + 1) {
              pdVar16 = u[(int)dVar99];
              dVar114 = u[(int)uVar42][uVar32];
              u[(int)uVar42][uVar32] = pdVar16[uVar32];
              pdVar16[uVar32] = dVar114;
            }
          }
        }
      }
    }
    uVar32 = 0;
    do {
      if (uVar47 == uVar32) {
        return 0;
      }
      pdVar16 = vi + uVar32;
      uVar32 = uVar32 + 1;
    } while ((*pdVar16 == 0.0) && (!NAN(*pdVar16)));
    return 2;
  }
  auVar52 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  auVar69 = vshufpd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_,1);
  auVar105 = ZEXT1664(auVar69);
  uVar39 = (ulong)(int)uVar23;
  uVar32 = uVar39;
LAB_0010fbde:
  lVar34 = uVar32 * 8;
  auVar53 = in_ZMM19._0_16_;
  auVar54 = in_ZMM20._0_16_;
  auVar69 = auVar105._0_16_;
  do {
    if ((long)uVar32 < 0) {
      for (uVar32 = 0; uVar32 != uVar47; uVar32 = uVar32 + 1) {
        uVar29 = uVar32;
        if (((long)uVar32 < lVar33) || (lVar28 < (long)uVar32)) {
          for (; (uint)n != uVar29; uVar29 = uVar29 + 1) {
            u[uVar32][uVar29] = a[uVar32][uVar29];
          }
        }
      }
      for (; lVar33 <= (long)uVar39; uVar39 = uVar39 - 1) {
        uVar49 = local_1c4;
        if ((int)(uint)uVar39 < (int)local_1c4) {
          uVar49 = (uint)uVar39;
        }
        for (lVar34 = lVar33; lVar34 <= lVar28; lVar34 = lVar34 + 1) {
          auVar51 = ZEXT816(0) << 0x40;
          lVar40 = lVar33;
          while (lVar40 <= (int)uVar49) {
            ppdVar48 = a + lVar40;
            auVar77._8_8_ = 0;
            auVar77._0_8_ = u[lVar34][lVar40];
            lVar40 = lVar40 + 1;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = (*ppdVar48)[uVar39];
            auVar51 = vfmadd231sd_fma(auVar51,auVar77,auVar15);
          }
          u[lVar34][uVar39] = auVar51._0_8_;
        }
      }
      local_1c4 = EigenRG(int,double**,double*,double*,double**,int*,double*)::is2;
      uVar49 = EigenRG(int,double**,double*,double*,double**,int*,double*)::is1;
      goto LAB_0011048a;
    }
    dVar114 = *(double *)((long)v + lVar34);
    dVar82 = *(double *)((long)vi + lVar34);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = dVar82;
    vucomisd_avx512f(auVar80);
    if (uVar32 == 0) {
      if ((dVar82 == 0.0) && (!NAN(dVar82))) {
        *(undefined8 *)(*(long *)((long)a + lVar34) + lVar34) = 0x3ff0000000000000;
      }
    }
    else {
      lVar40 = *(long *)((long)a + lVar34 + -8);
      lVar36 = *(long *)((long)a + lVar34);
      dVar81 = *(double *)(lVar36 + -8 + lVar34);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = dVar81;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = *(ulong *)(lVar40 + lVar34);
      pdVar16 = (double *)(lVar40 + lVar34);
      auVar58 = vandpd_avx512vl(auVar70,auVar51);
      auVar59 = vandpd_avx512vl(auVar74,auVar51);
      if (auVar58._0_8_ <= auVar59._0_8_) {
        auVar58 = vxorpd_avx512vl(auVar74,auVar149._0_16_);
        CDiv(0.0,auVar58._0_8_,pdVar16[-1] - dVar114,dVar82,(double *)(lVar40 + -8 + lVar34),pdVar16
            );
        auVar105 = ZEXT1664(auVar69);
        in_ZMM20 = ZEXT1664(auVar54);
        in_ZMM19 = ZEXT1664(auVar53);
        auVar58 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
        auVar149 = ZEXT1664(auVar58);
        auVar148 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        lVar36 = *(long *)((long)a + lVar34);
      }
      else {
        pdVar16[-1] = dVar82 / dVar81;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = *(double *)(lVar36 + lVar34) - dVar114;
        auVar58 = vxorpd_avx512vl(auVar71,auVar149._0_16_);
        *pdVar16 = auVar58._0_8_ / *(double *)(lVar36 + -8 + lVar34);
      }
      *(undefined1 (*) [16])(lVar36 + -8 + lVar34) = auVar52;
      if (1 < uVar32) goto LAB_0010fd78;
    }
    lVar34 = lVar34 + -8;
    uVar32 = uVar32 - 1;
  } while( true );
code_r0x0010f32c:
  auVar100._8_8_ = 0;
  auVar100._0_8_ = a[uVar29 - 1][uVar29 - 1];
  auVar115._8_8_ = 0;
  auVar115._0_8_ = a[uVar29][uVar29];
  auVar106._8_8_ = 0;
  auVar106._0_8_ = a[uVar29][uVar29 - 1];
  uVar38 = uVar37 - 1;
  uVar29 = uVar29 - 1;
  auVar53 = vandpd_avx512vl(auVar100,auVar51);
  auVar54 = vandpd_avx512vl(auVar115,auVar51);
  auVar53 = vaddsd_avx512f(auVar53,auVar54);
  auVar54 = vandpd_avx512vl(auVar106,auVar51);
  uVar95 = vcmpsd_avx512f(auVar53,auVar69,0);
  bVar50 = (bool)((byte)uVar95 & 1);
  auVar55._0_8_ = (ulong)bVar50 * (long)dVar99 + (ulong)!bVar50 * auVar53._0_8_;
  auVar55._8_8_ = auVar53._8_8_;
  in_ZMM20 = ZEXT1664(auVar55);
  vaddsd_avx512f(auVar54,auVar55);
  vucomisd_avx512f(auVar55);
  uVar37 = uVar38;
  if ((uVar29 != 0) || ((POPCOUNT(uVar29 & 0xff) & 1U) == 0)) goto LAB_0010f327;
LAB_0010f393:
  dVar82 = pdVar16[uVar39];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar82;
  if (uVar38 == uVar42) {
    uVar95 = in_ZMM6._0_8_;
    pdVar16[uVar39] = dVar114 + dVar82;
    v[uVar39] = dVar114 + dVar82;
    dVar82 = 0.0;
    goto LAB_0010f9ce;
  }
  pdVar17 = a[lVar36];
  dVar81 = pdVar16[lVar36];
  dVar2 = pdVar17[uVar39];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar81 * dVar2;
  dVar78 = pdVar17[lVar36];
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar78;
  if (uVar38 != uVar31) {
    bVar50 = iVar24 == 0;
    iVar24 = iVar24 + -1;
    if (bVar50) {
      if (uVar42 != 0) {
        puts("\nInternal error in \'EigenRealGeneral\'.");
        printf("rc = %d\n",uVar32);
        return 1;
      }
      goto LAB_0011048a;
    }
    if ((local_178._0_4_ == 0x14) || (local_178._0_4_ == 10)) {
      dVar114 = dVar114 + dVar82;
      for (lVar35 = lVar33; lVar35 <= (long)uVar39; lVar35 = lVar35 + 1) {
        a[lVar35][lVar35] = a[lVar35][lVar35] - dVar82;
      }
      auVar108._8_8_ = 0;
      auVar108._0_8_ = pdVar17[lVar40];
      auVar101._8_8_ = 0;
      auVar101._0_8_ = pdVar16[lVar36];
      auVar53 = vandpd_avx512vl(auVar108,auVar51);
      auVar54 = vandpd_avx512vl(auVar101,auVar51);
      auVar53 = vaddsd_avx512f(auVar54,auVar53);
      in_ZMM20 = ZEXT1664(auVar53);
      auVar54 = vmulsd_avx512f(auVar53,ZEXT816(0xbfdc000000000000));
      auVar56 = vmulsd_avx512f(auVar53,ZEXT816(0x3fe8000000000000));
      auVar57 = vmulsd_avx512f(auVar53,auVar54);
      auVar107 = auVar56;
    }
    auVar105 = ZEXT1664(auVar56);
    lVar45 = (long)(int)uVar38;
    auVar53 = vxorpd_avx512vl(auVar57,auVar52);
    local_178._0_4_ = local_178._0_4_ + 1;
    lVar35 = lVar45 + -1;
    if (lVar40 <= lVar45 + -1) {
      lVar35 = lVar40;
    }
    lVar30 = 0;
    do {
      if (lVar40 + lVar30 < lVar45) {
        uVar27 = (uint)lVar35;
        goto LAB_0010f5a2;
      }
      pdVar18 = a[lVar40 + lVar30];
      dVar82 = pdVar18[lVar40 + lVar30];
      in_ZMM19 = ZEXT864((ulong)dVar82);
      auVar127._8_8_ = 0;
      auVar127._0_8_ = a[lVar40 + lVar30 + 1][lVar40 + lVar30 + 1];
      auVar150._8_8_ = 0;
      auVar150._0_8_ = dVar82;
      auVar58 = vsubsd_avx512f(auVar56,auVar150);
      auVar59 = vsubsd_avx512f(auVar127,auVar150);
      auVar151._8_8_ = 0;
      auVar151._0_8_ = dVar82;
      auVar60 = vsubsd_avx512f(auVar107,auVar151);
      auVar54 = vfmadd213sd_fma(auVar60,auVar58,auVar53);
      auVar137._8_8_ = 0;
      auVar137._0_8_ = (auVar59._0_8_ - auVar58._0_8_) - auVar60._0_8_;
      auVar58 = vandpd_avx512vl(auVar137,auVar51);
      auVar155._8_8_ = 0;
      auVar155._0_8_ = a[lVar40 + lVar30 + 2][lVar40 + lVar30 + 1];
      auVar59 = vandpd_avx512vl(auVar155,auVar51);
      auVar83._8_8_ = 0;
      auVar83._0_8_ =
           auVar54._0_8_ / a[lVar40 + lVar30 + 1][lVar40 + lVar30] + pdVar18[lVar40 + lVar30 + 1];
      auVar54 = vandpd_avx512vl(auVar83,auVar51);
      auVar96._8_8_ = 0;
      auVar96._0_8_ = auVar58._0_8_ + auVar54._0_8_;
      auVar54 = vaddsd_avx512f(auVar59,auVar96);
      in_ZMM20 = ZEXT1664(auVar54);
      auVar58 = vunpcklpd_avx512vl(auVar137,auVar155);
      auVar59 = vmovddup_avx512vl(auVar54);
      auVar60 = vdivsd_avx512f(auVar83,auVar54);
      in_ZMM5 = ZEXT1664(auVar60);
      auVar54 = vdivpd_avx(auVar58,auVar59);
      in_ZMM6 = ZEXT1664(auVar54);
      uVar27 = uVar38;
      if (lVar45 - lVar40 == lVar30) goto LAB_0010f5a2;
      auVar61 = vandpd_avx512vl(auVar151,auVar67);
      auVar58 = vandpd_avx(auVar127,auVar67);
      auVar59 = vandpd_avx(auVar67,auVar60);
      auVar142._8_8_ = 0;
      auVar142._0_8_ = a[lVar40 + lVar30 + -1][lVar40 + lVar30 + -1];
      auVar60 = vandpd_avx(auVar142,auVar67);
      auVar143._8_8_ = 0;
      auVar143._0_8_ = pdVar18[lVar40 + lVar30 + -1];
      lVar30 = lVar30 + -1;
      dVar82 = auVar59._0_8_ * (auVar58._0_8_ + auVar61._0_8_ + auVar60._0_8_);
      auVar54 = vandpd_avx(auVar67,auVar54);
      auVar138._0_8_ = auVar54._0_8_ + auVar54._8_8_;
      auVar138._8_8_ = auVar54._0_8_ + auVar54._8_8_;
      auVar54 = vandpd_avx(auVar143,auVar67);
      auVar128._8_8_ = 0;
      auVar128._0_8_ = dVar82;
      auVar54 = vfmadd213sd_fma(auVar138,auVar54,auVar128);
    } while ((auVar54._0_8_ != dVar82) || (NAN(auVar54._0_8_) || NAN(dVar82)));
    uVar27 = (int)lVar30 + uVar31;
LAB_0010f5a2:
    lVar45 = 0;
    for (lVar35 = (long)(int)(uVar27 + 2); lVar35 <= (long)uVar39; lVar35 = lVar35 + 1) {
      pdVar18 = a[lVar35];
      pdVar18[lVar35 + -2] = 0.0;
      bVar50 = lVar45 != 0;
      lVar45 = lVar45 + -1;
      if (bVar50) {
        pdVar18[lVar35 + -3] = 0.0;
      }
    }
    lVar45 = (long)(int)uVar27;
    iVar44 = uVar27 + 3;
    lVar35 = lVar45;
    while( true ) {
      dVar82 = auVar105._0_8_;
      auVar85 = in_ZMM5._0_16_;
      auVar53 = in_ZMM6._0_16_;
      uVar43 = (long)iVar44;
      if ((long)uVar39 < (long)iVar44) {
        uVar43 = uVar39;
      }
      if ((long)uVar43 < 0) {
        uVar43 = 0xffffffffffffffff;
      }
      uVar29 = uVar39;
      uVar37 = uVar42 + 1;
      if ((long)uVar39 <= lVar35) break;
      if (lVar35 == lVar45) {
LAB_0010f674:
        auVar54 = vshufpd_avx(auVar53,auVar53,1);
        auVar129._8_8_ = 0x8000000000000000;
        auVar129._0_8_ = 0x8000000000000000;
        auVar111._8_8_ = 0;
        auVar111._0_8_ = auVar53._0_8_ * auVar53._0_8_;
        auVar58 = vfmadd231sd_fma(auVar111,auVar85,auVar85);
        auVar58 = vfmadd231sd_fma(auVar58,auVar54,auVar54);
        auVar58 = vsqrtsd_avx(auVar58,auVar58);
        auVar139._0_8_ = auVar58._0_8_ ^ 0x8000000000000000;
        auVar139._8_8_ = auVar58._8_8_ ^ 0x8000000000000000;
        uVar95 = vcmpsd_avx512f(auVar139,auVar58,2);
        bVar50 = (bool)((byte)uVar95 & 1);
        auVar62._0_8_ = (ulong)bVar50 * auVar58._0_8_ + !bVar50 * auVar139._0_8_;
        auVar62._8_8_ = auVar139._8_8_;
        uVar95 = vcmpsd_avx512f(auVar69,auVar85,2);
        bVar50 = (bool)((byte)uVar95 & 1);
        auVar58 = vxorpd_avx512vl(auVar62,auVar129);
        auVar63._0_8_ = (ulong)bVar50 * auVar62._0_8_ + (ulong)!bVar50 * auVar58._0_8_;
        auVar63._8_8_ = auVar58._8_8_;
        in_ZMM20 = ZEXT1664(auVar63);
        if (lVar35 == lVar45) {
          if (uVar38 != uVar27) {
            auVar102._8_8_ = 0;
            auVar102._0_8_ = a[lVar45][lVar45 + -1];
            auVar58 = vxorpd_avx512vl(auVar102,auVar52);
            dVar82 = (double)vmovlpd_avx(auVar58);
            a[lVar45][lVar45 + -1] = dVar82;
          }
        }
        else {
          auVar58 = vxorpd_avx512vl(auVar63,auVar52);
          a[lVar35][lVar35 + -1] = auVar58._0_8_ * dVar82;
        }
        auVar58 = vaddsd_avx512f(auVar85,auVar63);
        in_ZMM5 = ZEXT1664(auVar58);
        auVar54 = vdivsd_avx512f(auVar54,auVar63);
        in_ZMM19 = ZEXT1664(auVar54);
        auVar59 = vdivsd_avx512f(auVar53,auVar63);
        auVar116._8_8_ = auVar58._0_8_;
        auVar116._0_8_ = auVar58._0_8_;
        auVar58 = vdivsd_avx512f(auVar58,auVar63);
        auVar105 = ZEXT1664(auVar58);
        auVar53 = vdivpd_avx(auVar53,auVar116);
        in_ZMM6 = ZEXT1664(auVar53);
        dVar82 = auVar59._0_8_;
        lVar30 = lVar36;
        if (lVar35 == lVar36) {
          for (; lVar30 < lVar34; lVar30 = lVar30 + 1) {
            pdVar18 = a[lVar36 + 1];
            auVar117._8_8_ = 0;
            auVar117._0_8_ = pdVar17[lVar30];
            auVar86._8_8_ = 0;
            auVar86._0_8_ = pdVar18[lVar30];
            auVar54 = vfmadd213sd_fma(auVar86,auVar53,auVar117);
            in_ZMM5 = ZEXT1664(auVar54);
            auVar60 = vfnmadd231sd_fma(auVar117,auVar54,auVar58);
            pdVar17[lVar30] = auVar60._0_8_;
            auVar118._8_8_ = 0;
            auVar118._0_8_ = pdVar18[lVar30];
            auVar54 = vfnmadd231sd_fma(auVar118,auVar54,auVar59);
            pdVar18[lVar30] = auVar54._0_8_;
          }
          lVar30 = 0;
          while (lVar41 = lVar33, (long)(int)uVar26 + 1 != lVar30) {
            pdVar18 = a[lVar30];
            lVar30 = lVar30 + 1;
            auVar133._8_8_ = 0;
            auVar133._0_8_ = pdVar18[lVar36 + 1];
            auVar119._8_8_ = 0;
            auVar119._0_8_ = pdVar18[lVar36];
            auVar88._8_8_ = 0;
            auVar88._0_8_ = dVar82 * pdVar18[lVar36 + 1];
            auVar54 = vfmadd231sd_fma(auVar88,auVar58,auVar119);
            in_ZMM5 = ZEXT1664(auVar54);
            auVar59 = vfnmadd231sd_fma(auVar133,auVar54,auVar53);
            pdVar18[lVar36] = pdVar18[lVar36] - auVar54._0_8_;
            pdVar18[lVar36 + 1] = auVar59._0_8_;
          }
          while (lVar41 <= lVar28) {
            pdVar18 = u[lVar41];
            auVar134._8_8_ = 0;
            auVar134._0_8_ = pdVar18[lVar36 + 1];
            auVar121._8_8_ = 0;
            auVar121._0_8_ = pdVar18[lVar36];
            auVar90._8_8_ = 0;
            auVar90._0_8_ = dVar82 * pdVar18[lVar36 + 1];
            auVar54 = vfmadd231sd_fma(auVar90,auVar58,auVar121);
            in_ZMM5 = ZEXT1664(auVar54);
            auVar59 = vfnmadd231sd_fma(auVar134,auVar54,auVar53);
            pdVar18[lVar36] = pdVar18[lVar36] - auVar54._0_8_;
            pdVar18[lVar36 + 1] = auVar59._0_8_;
            lVar41 = lVar41 + 1;
          }
        }
        else {
          auVar60 = vshufpd_avx(auVar53,auVar53,1);
          for (lVar30 = lVar35; lVar30 < lVar34; lVar30 = lVar30 + 1) {
            pdVar18 = a[lVar35 + 1];
            pdVar19 = a[lVar35 + 2];
            auVar130._8_8_ = 0;
            auVar130._0_8_ = a[lVar35][lVar30];
            auVar87._8_8_ = 0;
            auVar87._0_8_ = pdVar18[lVar30];
            auVar61 = vfmadd213sd_fma(auVar87,auVar53,auVar130);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = pdVar19[lVar30];
            auVar61 = vfmadd231sd_fma(auVar61,auVar60,auVar3);
            in_ZMM5 = ZEXT1664(auVar61);
            auVar65 = vfnmadd231sd_fma(auVar130,auVar61,auVar58);
            a[lVar35][lVar30] = auVar65._0_8_;
            auVar131._8_8_ = 0;
            auVar131._0_8_ = pdVar18[lVar30];
            auVar65 = vfnmadd231sd_fma(auVar131,auVar61,auVar59);
            pdVar18[lVar30] = auVar65._0_8_;
            auVar132._8_8_ = 0;
            auVar132._0_8_ = pdVar19[lVar30];
            auVar61 = vfnmadd231sd_avx512f(auVar132,auVar61,auVar54);
            pdVar19[lVar30] = auVar61._0_8_;
          }
          lVar30 = 0;
          while (lVar41 = lVar33, uVar43 + 1 != lVar30) {
            pdVar18 = a[lVar30];
            lVar30 = lVar30 + 1;
            auVar120._8_8_ = 0;
            auVar120._0_8_ = pdVar18[lVar35];
            auVar89._8_8_ = 0;
            auVar89._0_8_ = dVar82 * SUB168(*(undefined1 (*) [16])(pdVar18 + lVar35 + 1),0);
            auVar59 = vfmadd231sd_fma(auVar89,auVar58,auVar120);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = pdVar18[lVar35 + 2];
            auVar59 = vfmadd231sd_avx512f(auVar59,auVar54,auVar4);
            in_ZMM5 = ZEXT1664(auVar59);
            dVar81 = auVar59._0_8_;
            auVar140._8_8_ = dVar81;
            auVar140._0_8_ = dVar81;
            auVar59 = vfnmadd213pd_fma(auVar140,auVar53,*(undefined1 (*) [16])(pdVar18 + lVar35 + 1)
                                      );
            pdVar18[lVar35] = pdVar18[lVar35] - dVar81;
            *(undefined1 (*) [16])(pdVar18 + lVar35 + 1) = auVar59;
          }
          while (lVar41 <= lVar28) {
            pdVar18 = u[lVar41];
            auVar122._8_8_ = 0;
            auVar122._0_8_ = pdVar18[lVar35];
            auVar91._8_8_ = 0;
            auVar91._0_8_ = dVar82 * SUB168(*(undefined1 (*) [16])(pdVar18 + lVar35 + 1),0);
            auVar59 = vfmadd231sd_fma(auVar91,auVar58,auVar122);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = pdVar18[lVar35 + 2];
            auVar59 = vfmadd231sd_avx512f(auVar59,auVar54,auVar5);
            in_ZMM5 = ZEXT1664(auVar59);
            dVar81 = auVar59._0_8_;
            auVar141._8_8_ = dVar81;
            auVar141._0_8_ = dVar81;
            auVar59 = vfnmadd213pd_fma(auVar141,auVar53,*(undefined1 (*) [16])(pdVar18 + lVar35 + 1)
                                      );
            pdVar18[lVar35] = pdVar18[lVar35] - dVar81;
            *(undefined1 (*) [16])(pdVar18 + lVar35 + 1) = auVar59;
            lVar41 = lVar41 + 1;
          }
        }
      }
      else {
        auVar97 = ZEXT816(0) << 0x40;
        if (lVar35 != lVar36) {
          auVar97._8_8_ = 0;
          auVar97._0_8_ = a[lVar35 + 2][lVar35 + -1];
        }
        auVar84._8_8_ = 0;
        auVar84._0_8_ = a[lVar35][lVar35 + -1];
        in_ZMM5 = ZEXT1664(auVar84);
        auVar109._8_8_ = 0;
        auVar109._0_8_ = a[lVar35 + 1][lVar35 + -1];
        auVar54 = vandpd_avx512vl(auVar84,auVar51);
        auVar58 = vandpd_avx512vl(auVar109,auVar51);
        auVar59 = vandpd_avx512vl(auVar97,auVar51);
        auVar53 = vunpcklpd_avx(auVar109,auVar97);
        in_ZMM6 = ZEXT1664(auVar53);
        dVar82 = auVar59._0_8_ + auVar58._0_8_ + auVar54._0_8_;
        auVar105 = ZEXT864((ulong)dVar82);
        if ((dVar82 != 0.0) || (NAN(dVar82))) {
          auVar110._8_8_ = dVar82;
          auVar110._0_8_ = dVar82;
          auVar85._0_8_ = a[lVar35][lVar35 + -1] / dVar82;
          auVar85._8_8_ = 0;
          auVar53 = vdivpd_avx(auVar53,auVar110);
          goto LAB_0010f674;
        }
      }
      lVar35 = lVar35 + 1;
      iVar44 = iVar44 + 1;
    }
    goto LAB_0010f327;
  }
  dVar20 = dVar114 + dVar82;
  dVar82 = (dVar78 - dVar82) * 0.5;
  in_ZMM5 = ZEXT864((ulong)dVar82);
  pdVar16[uVar39] = dVar20;
  pdVar17[lVar36] = dVar78 + dVar114;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar82;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = dVar81 * dVar2;
  auVar53 = vfmadd213sd_fma(auVar92,auVar92,auVar123);
  auVar53 = vandpd_avx(auVar53,auVar67);
  auVar54 = vucomisd_avx512f(ZEXT816(0xbd719799812dea11));
  uVar95 = auVar54._0_8_;
  auVar53 = vsqrtsd_avx512f(auVar53,auVar53);
  in_ZMM19 = ZEXT1664(auVar53);
  if (uVar38 < uVar31) {
    v[lVar36] = dVar20 + dVar82;
    v[uVar39] = dVar20 + dVar82;
    vmovsd_avx512f(auVar53);
    vi[lVar36] = vi[lVar36];
    auVar53 = vxorpd_avx512vl(auVar53,auVar52);
    dVar82 = auVar53._0_8_;
    uVar31 = uVar25;
LAB_0010f9ce:
    uVar32 = (ulong)uVar31;
    in_ZMM6 = ZEXT1664(CONCAT88(in_ZMM6._8_8_,uVar95));
    vi[uVar39] = dVar82;
  }
  else {
    auVar112._8_8_ = 0x8000000000000000;
    auVar112._0_8_ = 0x8000000000000000;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = dVar82;
    uVar95 = vcmpsd_avx512f(auVar69,auVar93,2);
    bVar50 = (bool)((byte)uVar95 & 1);
    auVar54 = vxorpd_avx512vl(auVar53,auVar112);
    auVar64._0_8_ = (ulong)bVar50 * auVar53._0_8_ + (ulong)!bVar50 * auVar54._0_8_;
    auVar64._8_8_ = auVar54._8_8_;
    auVar53 = vaddsd_avx512f(auVar93,auVar64);
    in_ZMM19 = ZEXT1664(auVar53);
    auVar54 = vdivsd_avx512f(auVar123,auVar53);
    auVar103._8_8_ = 0;
    auVar103._0_8_ = dVar20;
    auVar58 = vaddsd_avx512f(auVar103,auVar53);
    uVar95 = vcmpsd_avx512f(auVar53,auVar69,4);
    bVar50 = (bool)((byte)uVar95 & 1);
    v[lVar36] = auVar58._0_8_;
    auVar59 = vandpd_avx512vl(auVar53,auVar51);
    v[uVar39] = (double)((ulong)bVar50 * (long)(dVar20 - auVar54._0_8_) +
                        (ulong)!bVar50 * (long)auVar58._0_8_);
    vi[lVar36] = 0.0;
    vi[uVar39] = 0.0;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = pdVar16[lVar36];
    auVar54 = vandpd_avx512vl(auVar94,auVar51);
    auVar54 = vaddsd_avx512f(auVar59,auVar54);
    in_ZMM20 = ZEXT1664(auVar54);
    auVar58 = vdivsd_avx512f(auVar53,auVar54);
    auVar54 = vdivsd_avx512f(auVar94,auVar54);
    dVar81 = auVar58._0_8_;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = dVar81 * dVar81;
    auVar53 = vfmadd231sd_fma(auVar98,auVar54,auVar54);
    auVar53 = vsqrtsd_avx(auVar53,auVar53);
    dVar82 = auVar54._0_8_ / auVar53._0_8_;
    in_ZMM5 = ZEXT1664(CONCAT88(auVar54._8_8_,dVar82));
    auVar104._0_8_ = dVar81 / auVar53._0_8_;
    auVar104._8_8_ = auVar58._8_8_;
    auVar113._0_8_ = -dVar82;
    auVar113._8_8_ = auVar54._8_8_ ^ 0x8000000000000000;
    for (lVar40 = lVar36; lVar40 < lVar34; lVar40 = lVar40 + 1) {
      in_ZMM19 = ZEXT864((ulong)pdVar17[lVar40]);
      auVar124._8_8_ = 0;
      auVar124._0_8_ = dVar82 * pdVar16[lVar40];
      auVar152._8_8_ = 0;
      auVar152._0_8_ = pdVar17[lVar40];
      auVar54 = vfmadd231sd_avx512f(auVar124,auVar104,auVar152);
      pdVar17[lVar40] = auVar54._0_8_;
      auVar54 = vmulsd_avx512f(auVar152,auVar113);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = pdVar16[lVar40];
      auVar54 = vfmadd231sd_fma(auVar54,auVar104,auVar6);
      pdVar16[lVar40] = auVar54._0_8_;
    }
    uVar32 = 0xffffffffffffffff;
    if (-1 < (long)uVar39) {
      uVar32 = uVar39;
    }
    lVar40 = 0;
    while (uVar32 + 1 != lVar40) {
      pdVar16 = a[lVar40];
      lVar40 = lVar40 + 1;
      in_ZMM19 = ZEXT864((ulong)pdVar16[lVar36]);
      auVar125._8_8_ = 0;
      auVar125._0_8_ = pdVar16[uVar39];
      auVar153._8_8_ = 0;
      auVar153._0_8_ = pdVar16[lVar36];
      auVar54 = vmulsd_avx512f(auVar153,auVar113);
      auVar135._8_8_ = 0;
      auVar135._0_8_ = pdVar16[uVar39] * dVar82;
      auVar58 = vfmadd231sd_avx512f(auVar135,auVar104,auVar153);
      auVar54 = vfmadd231sd_fma(auVar54,auVar104,auVar125);
      pdVar16[lVar36] = auVar58._0_8_;
      pdVar16[uVar39] = auVar54._0_8_;
    }
    uVar32 = (ulong)uVar25;
    lVar40 = lVar33;
    while (lVar40 <= lVar28) {
      pdVar16 = u[lVar40];
      lVar40 = lVar40 + 1;
      in_ZMM19 = ZEXT864((ulong)pdVar16[lVar36]);
      auVar126._8_8_ = 0;
      auVar126._0_8_ = pdVar16[uVar39];
      auVar154._8_8_ = 0;
      auVar154._0_8_ = pdVar16[lVar36];
      auVar54 = vmulsd_avx512f(auVar154,auVar113);
      auVar136._8_8_ = 0;
      auVar136._0_8_ = pdVar16[uVar39] * dVar82;
      auVar58 = vfmadd231sd_avx512f(auVar136,auVar104,auVar154);
      auVar54 = vfmadd231sd_fma(auVar54,auVar104,auVar126);
      pdVar16[lVar36] = auVar58._0_8_;
      pdVar16[uVar39] = auVar54._0_8_;
    }
    auVar53 = vunpcklpd_avx(auVar104,auVar53);
    in_ZMM6 = ZEXT1664(auVar53);
  }
  goto LAB_0010f285;
LAB_0010fd78:
  auVar53 = vxorpd_avx512vl(auVar80,auVar149._0_16_);
  auVar69 = vandpd_avx(auVar148._0_16_,auVar80);
  uVar49 = (int)uVar32 - 1;
  for (uVar23 = (int)uVar32 - 2; -1 < (int)uVar23; uVar23 = uVar23 - 1) {
    uVar29 = (ulong)uVar23;
    ppdVar48 = a + uVar29;
    lVar36 = uVar29 << 0x20;
    auVar54 = ZEXT816(0) << 0x40;
    auVar58 = ZEXT816(0) << 0x40;
    pdVar16 = *ppdVar48;
    lVar40 = (long)(int)uVar49;
    while (lVar40 <= (long)uVar32) {
      ppdVar1 = a + lVar40;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = pdVar16[lVar40];
      lVar40 = lVar40 + 1;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)((long)*ppdVar1 + lVar34 + -8);
      auVar54 = vfmadd231sd_fma(auVar54,auVar75,auVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)((long)*ppdVar1 + lVar34);
      auVar58 = vfmadd231sd_fma(auVar58,auVar75,auVar8);
    }
    dVar81 = vi[uVar29];
    auVar144._8_8_ = 0;
    auVar144._0_8_ = pdVar16[uVar29] - dVar114;
    if (0.0 <= dVar81) {
      auVar60 = in_ZMM19._0_16_;
      auVar61 = in_ZMM20._0_16_;
      auVar59 = auVar105._0_16_;
      if ((dVar81 != 0.0) || (NAN(dVar81))) {
        dVar2 = pdVar16[uVar29 + 1];
        auVar145._8_8_ = 0;
        auVar145._0_8_ = dVar2;
        auVar146._8_8_ = 0;
        auVar146._0_8_ = a[uVar29 + 1][uVar29];
        dVar78 = v[uVar29] - dVar114;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = dVar78;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = dVar81 * dVar81;
        auVar65 = vfmadd231sd_fma(auVar79,auVar76,auVar76);
        dVar81 = dVar82 * (dVar78 + dVar78);
        auVar65 = vfmadd231sd_fma(auVar65,auVar53,auVar80);
        dVar78 = auVar65._0_8_;
        local_a8 = auVar69._0_8_;
        if ((dVar78 != 0.0) || ((dVar81 != 0.0 || (NAN(dVar81))))) {
          auVar65 = vandpd_avx512vl(auVar145,auVar51);
          local_128 = auVar65._0_8_;
          auVar65 = vandpd_avx512vl(auVar60,auVar51);
          local_f8 = auVar65._0_8_;
        }
        else {
          auVar65 = vandpd_avx512vl(auVar144,auVar51);
          auVar66 = vandpd_avx512vl(auVar145,auVar51);
          local_128 = auVar66._0_8_;
          auVar66 = vandpd_avx512vl(auVar146,auVar51);
          auVar67 = vandpd_avx512vl(auVar60,auVar51);
          local_f8 = auVar67._0_8_;
          dVar20 = (local_f8 + auVar65._0_8_ + local_a8 + local_128 + auVar66._0_8_) * dVar99;
          dVar78 = dVar20;
          do {
            dVar78 = dVar78 * 0.01;
          } while (dVar20 < dVar20 + dVar78);
        }
        auVar65 = vmulsd_avx512f(auVar54,auVar60);
        auVar66 = vmulsd_avx512f(auVar58,auVar60);
        auVar65 = vfmsub231sd_fma(auVar65,auVar145,auVar59);
        auVar66 = vfmsub231sd_avx512f(auVar66,auVar145,auVar61);
        auVar65 = vfmadd231sd_fma(auVar65,auVar80,auVar58);
        auVar66 = vfmadd231sd_fma(auVar66,auVar53,auVar54);
        CDiv(auVar65._0_8_,auVar66._0_8_,dVar78,dVar81,(double *)((long)pdVar16 + lVar34 + -8),
             (double *)((long)pdVar16 + lVar34));
        pdVar16 = a[uVar29];
        pdVar17 = a[uVar29 + 1];
        auVar72._8_8_ = 0;
        auVar72._0_8_ = *(ulong *)((long)pdVar16 + lVar34 + -8);
        if (local_128 <= local_f8 + local_a8) {
          local_158 = auVar105._0_8_;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_158;
          auVar58 = vfnmsub213sd_fma(auVar72,auVar146,auVar13);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = *(ulong *)((long)pdVar16 + lVar34);
          auVar54 = vfnmsub132sd_fma(auVar146,auVar61,auVar14);
          CDiv(auVar58._0_8_,auVar54._0_8_,in_ZMM19._0_8_,dVar82,
               (double *)((long)pdVar17 + lVar34 + -8),(double *)((long)pdVar17 + lVar34));
          auVar65 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
        }
        else {
          auVar65 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
          auVar9._8_8_ = 0;
          auVar9._0_8_ = auVar54._0_8_;
          auVar54 = vfnmsub213sd_fma(auVar72,auVar144,auVar9);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)((long)pdVar16 + lVar34);
          auVar54 = vfmadd231sd_fma(auVar54,auVar80,auVar10);
          *(double *)((long)pdVar17 + lVar34 + -8) = auVar54._0_8_ / dVar2;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)((long)pdVar16 + lVar34);
          auVar54 = vfnmsub231sd_fma(auVar58,auVar144,auVar11);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)((long)pdVar16 + lVar34 + -8);
          auVar54 = vfmadd231sd_fma(auVar54,auVar53,auVar12);
          *(double *)((long)pdVar17 + lVar34) = auVar54._0_8_ / dVar2;
        }
      }
      else {
        CDiv(-auVar54._0_8_,-auVar58._0_8_,pdVar16[uVar29] - dVar114,dVar82,
             (double *)((long)pdVar16 + lVar34 + -8),(double *)((long)pdVar16 + lVar34));
        auVar65 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
      }
      auVar147._8_8_ = 0x7fffffffffffffff;
      auVar147._0_8_ = 0x7fffffffffffffff;
      auVar149 = ZEXT1664(auVar65);
      auVar148 = ZEXT1664(auVar147);
      auVar54 = vandpd_avx(auVar147,*(undefined1 (*) [16])((long)a[uVar29] + lVar34 + -8));
      auVar58 = vshufps_avx(auVar54,auVar54,0x4e);
      auVar54 = vmaxsd_avx(auVar54,auVar58);
      auVar73._0_8_ = auVar54._0_8_;
      auVar54 = auVar59;
      auVar144 = auVar60;
      auVar58 = auVar61;
      uVar49 = uVar23;
      if (((auVar73._0_8_ != 0.0) || (NAN(auVar73._0_8_))) &&
         (auVar73._0_8_ + 1.0 / auVar73._0_8_ <= auVar73._0_8_)) {
        auVar73._8_8_ = auVar73._0_8_;
        while (lVar36 >> 0x20 <= (long)uVar32) {
          pdVar16 = *ppdVar48;
          ppdVar48 = ppdVar48 + 1;
          lVar36 = lVar36 + 0x100000000;
          auVar59 = vdivpd_avx(*(undefined1 (*) [16])((long)pdVar16 + lVar34 + -8),auVar73);
          *(undefined1 (*) [16])((long)pdVar16 + lVar34 + -8) = auVar59;
        }
      }
    }
    in_ZMM20 = ZEXT1664(auVar58);
    in_ZMM19 = ZEXT1664(auVar144);
    auVar105 = ZEXT1664(auVar54);
  }
  uVar32 = uVar32 - 1;
  goto LAB_0010fbde;
}

Assistant:

int EigenRealGeneral (int n, double **a, double *v, double *vi, double **u, int *iwork, double *work)
	/*      n = order of a                                                      */
	/*    **a = input matrix in row-ptr representation; will be destroyed       */
	/*     *v = array of size 'n' to receive eigenvalues                        */
	/*    *vi = work vector of size 'n' for imaginary components of eigenvalues */
	/*    **u = matrix in row-ptr representation to receive eigenvectors        */
	/* *iwork = work vector of size 'n'                                         */
	/*  *work = work vector of size 'n'                                         */
{
	int			i, rc;

	rc = EigenRG (n, a, v, vi, u, iwork, work);
	if (rc != NO_ERROR)
		{
		puts("\nInternal error in 'EigenRealGeneral'.");
		printf ("rc = %d\n", rc);
		return ERROR;
		}

	for (i = 0; i < n; i++)
		{
		if (vi[i] != 0.0)
			return RC_COMPLEX_EVAL;
		}

	return NO_ERROR;
}